

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O2

EC_POINT * OSSL::byteString2pt(ByteString *byteString,EC_GROUP *grp)

{
  int iVar1;
  size_t len;
  EC_POINT *p;
  uchar *buf;
  ulong e;
  char *pcVar2;
  ByteString raw;
  
  DERUTIL::octet2Raw(&raw,byteString);
  len = ByteString::size(&raw);
  if (len != 0) {
    p = EC_POINT_new((EC_GROUP *)grp);
    buf = ByteString::operator[](&raw,0);
    iVar1 = EC_POINT_oct2point((EC_GROUP *)grp,p,buf,len,(BN_CTX *)0x0);
    if (iVar1 != 0) goto LAB_00125426;
    e = ERR_get_error();
    pcVar2 = ERR_error_string(e,(char *)0x0);
    softHSMLog(3,"byteString2pt",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLUtil.cpp"
               ,0x71,"EC_POINT_oct2point failed: %s",pcVar2);
    EC_POINT_free(p);
  }
  p = (EC_POINT *)0x0;
LAB_00125426:
  ByteString::~ByteString(&raw);
  return (EC_POINT *)p;
}

Assistant:

EC_POINT* OSSL::byteString2pt(const ByteString& byteString, const EC_GROUP* grp)
{
	ByteString raw = DERUTIL::octet2Raw(byteString);
	size_t len = raw.size();
	if (len == 0) return NULL;

	EC_POINT* pt = EC_POINT_new(grp);
	if (!EC_POINT_oct2point(grp, pt, &raw[0], len, NULL))
	{
		ERROR_MSG("EC_POINT_oct2point failed: %s", ERR_error_string(ERR_get_error(), NULL));
		EC_POINT_free(pt);
		return NULL;
	}
	return pt;
}